

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void ITransform_SSE2(uint8_t *ref,int16_t *in,uint8_t *dst,int do_two)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  longlong lVar31;
  longlong lVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  longlong lVar41;
  longlong lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  int in_ECX;
  uint8_t *in_RDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  short sVar55;
  short sVar56;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  __m128i ref3;
  __m128i ref2;
  __m128i ref1;
  __m128i ref0;
  __m128i zero;
  __m128i shifted3;
  __m128i shifted2;
  __m128i shifted1;
  __m128i shifted0;
  __m128i tmp3_1;
  __m128i tmp2_1;
  __m128i tmp1_1;
  __m128i tmp0_1;
  __m128i d_1;
  __m128i d4_1;
  __m128i d3_1;
  __m128i d2_1;
  __m128i d1_1;
  __m128i c_1;
  __m128i c4_1;
  __m128i c3_1;
  __m128i c2_1;
  __m128i c1_1;
  __m128i b_1;
  __m128i a_1;
  __m128i dc;
  __m128i four;
  __m128i tmp3;
  __m128i tmp2;
  __m128i tmp1;
  __m128i tmp0;
  __m128i d;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i c;
  __m128i c4;
  __m128i c3;
  __m128i c2;
  __m128i c1;
  __m128i b;
  __m128i a;
  __m128i inB3;
  __m128i inB2;
  __m128i inB1;
  __m128i inB0;
  __m128i in3;
  __m128i in2;
  __m128i in1;
  __m128i in0;
  __m128i T3;
  __m128i T2;
  __m128i T1;
  __m128i T0;
  __m128i k2;
  __m128i k1;
  __m128i *in_stack_fffffffffffff1f8;
  __m128i *in1_00;
  __m128i *in0_00;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined2 in_stack_fffffffffffff3a0;
  undefined2 in_stack_fffffffffffff3a2;
  undefined2 in_stack_fffffffffffff3a4;
  undefined2 in_stack_fffffffffffff3a6;
  undefined2 in_stack_fffffffffffff3a8;
  undefined2 in_stack_fffffffffffff3aa;
  undefined2 in_stack_fffffffffffff3ac;
  undefined2 in_stack_fffffffffffff3ae;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 uStack_ae0;
  undefined8 uStack_ad0;
  undefined8 uStack_ac0;
  undefined8 uStack_ab0;
  longlong local_aa8;
  longlong lStack_aa0;
  longlong local_a98;
  longlong lStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  int local_a44;
  uint8_t *local_a40;
  ulong *local_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined2 local_a0e;
  undefined2 local_a0c;
  undefined2 local_a0a;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  longlong local_988;
  longlong lStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined4 local_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined4 local_89c;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined4 local_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined4 local_85c;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined2 local_838;
  undefined2 local_836;
  undefined2 local_834;
  undefined2 local_832;
  undefined2 local_830;
  undefined2 local_82e;
  undefined2 local_82c;
  undefined2 local_82a;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined2 local_818;
  undefined2 local_816;
  undefined2 local_814;
  undefined2 local_812;
  undefined2 local_810;
  undefined2 local_80e;
  undefined2 local_80c;
  undefined2 local_80a;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined2 local_7f8;
  undefined2 local_7f6;
  undefined2 local_7f4;
  undefined2 local_7f2;
  undefined2 local_7f0;
  undefined2 local_7ee;
  undefined2 local_7ec;
  undefined2 local_7ea;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  ulong local_768;
  undefined8 uStack_760;
  ulong *local_750;
  ulong local_748;
  undefined8 uStack_740;
  ulong *local_730;
  ulong local_728;
  undefined8 uStack_720;
  ulong *local_710;
  ulong local_708;
  undefined8 uStack_700;
  ulong *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 *local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 *local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  longlong local_368;
  longlong lStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  uint32_t local_16c;
  undefined1 local_168 [16];
  uint32_t local_14c;
  undefined1 local_148 [16];
  uint32_t local_12c;
  undefined1 local_128 [16];
  uint32_t local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  longlong local_f8;
  longlong lStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_a0a = 0x4e7b;
  local_82a = 0x4e7b;
  local_82c = 0x4e7b;
  local_82e = 0x4e7b;
  local_830 = 0x4e7b;
  local_832 = 0x4e7b;
  local_834 = 0x4e7b;
  local_836 = 0x4e7b;
  local_838 = 0x4e7b;
  local_a58 = 0x4e7b4e7b4e7b4e7b;
  uStack_a50 = 0x4e7b4e7b4e7b4e7b;
  local_a0c = 0x8a8c;
  local_80a = 0x8a8c;
  local_80c = 0x8a8c;
  local_80e = 0x8a8c;
  local_810 = 0x8a8c;
  local_812 = 0x8a8c;
  local_814 = 0x8a8c;
  local_816 = 0x8a8c;
  local_818 = 0x8a8c;
  local_a68 = 0x8a8c8a8c8a8c8a8c;
  uStack_a60 = 0x8a8c8a8c8a8c8a8c;
  local_8d8 = *in_RSI;
  uStack_600 = 0;
  uStack_ab0 = 0;
  local_610 = in_RSI + 1;
  local_628 = *local_610;
  uStack_620 = 0;
  uStack_ac0 = 0;
  local_630 = in_RSI + 2;
  local_8e8 = *local_630;
  uStack_640 = 0;
  uStack_ad0 = 0;
  local_650 = in_RSI + 3;
  local_668 = *local_650;
  uStack_660 = 0;
  uStack_ae0 = 0;
  if (in_ECX != 0) {
    local_670 = in_RSI + 4;
    uStack_ab0 = *local_670;
    uStack_680 = 0;
    local_690 = in_RSI + 5;
    uStack_ac0 = *local_690;
    uStack_6a0 = 0;
    local_6b0 = in_RSI + 6;
    uStack_ad0 = *local_6b0;
    uStack_6c0 = 0;
    local_6d0 = in_RSI + 7;
    uStack_ae0 = *local_6d0;
    uStack_6e0 = 0;
    uStack_190 = 0;
    uStack_1a0 = 0;
    uStack_1b0 = 0;
    uStack_1c0 = 0;
    uStack_1d0 = 0;
    uStack_1e0 = 0;
    uStack_1f0 = 0;
    uStack_200 = 0;
    local_6e8 = uStack_ae0;
    local_6c8 = uStack_ad0;
    local_6a8 = uStack_ac0;
    local_688 = uStack_ab0;
    local_208 = uStack_ae0;
    local_1f8 = local_668;
    local_1e8 = uStack_ad0;
    local_1d8 = local_8e8;
    local_1c8 = uStack_ac0;
    local_1b8 = local_628;
    local_1a8 = uStack_ab0;
    local_198 = local_8d8;
  }
  uStack_210 = uStack_ab0;
  uVar54 = uStack_210;
  uStack_220 = uStack_ad0;
  uVar53 = uStack_220;
  local_218._0_2_ = (short)local_8d8;
  local_218._2_2_ = (short)((ulong)local_8d8 >> 0x10);
  local_218._4_2_ = (short)((ulong)local_8d8 >> 0x20);
  local_218._6_2_ = (short)((ulong)local_8d8 >> 0x30);
  uStack_210._0_2_ = (short)uStack_ab0;
  uStack_210._2_2_ = (short)((ulong)uStack_ab0 >> 0x10);
  uStack_210._4_2_ = (short)((ulong)uStack_ab0 >> 0x20);
  uStack_210._6_2_ = (short)((ulong)uStack_ab0 >> 0x30);
  local_228._0_2_ = (short)local_8e8;
  local_228._2_2_ = (short)((ulong)local_8e8 >> 0x10);
  local_228._4_2_ = (short)((ulong)local_8e8 >> 0x20);
  local_228._6_2_ = (short)((ulong)local_8e8 >> 0x30);
  uStack_220._0_2_ = (short)uStack_ad0;
  uStack_220._2_2_ = (short)((ulong)uStack_ad0 >> 0x10);
  uStack_220._4_2_ = (short)((ulong)uStack_ad0 >> 0x20);
  uStack_220._6_2_ = (short)((ulong)uStack_ad0 >> 0x30);
  uStack_8d0 = uStack_ab0;
  uStack_8e0 = uStack_ad0;
  uStack_10 = uStack_ac0;
  auVar18._8_8_ = uStack_ac0;
  auVar18._0_8_ = local_628;
  auVar17._8_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar17._0_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar57 = pmulhw(auVar18,auVar17);
  uStack_30 = uStack_ae0;
  auVar16._8_8_ = uStack_ae0;
  auVar16._0_8_ = local_668;
  auVar15._8_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar15._0_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar58 = pmulhw(auVar16,auVar15);
  uStack_8f0 = uStack_ac0;
  uVar34 = uStack_8f0;
  uStack_900 = uStack_ae0;
  uVar33 = uStack_900;
  local_8f8._0_2_ = (short)local_628;
  local_8f8._2_2_ = (short)((ulong)local_628 >> 0x10);
  local_8f8._4_2_ = (short)((ulong)local_628 >> 0x20);
  local_8f8._6_2_ = (short)((ulong)local_628 >> 0x30);
  uStack_8f0._0_2_ = (short)uStack_ac0;
  uStack_8f0._2_2_ = (short)((ulong)uStack_ac0 >> 0x10);
  uStack_8f0._4_2_ = (short)((ulong)uStack_ac0 >> 0x20);
  uStack_8f0._6_2_ = (short)((ulong)uStack_ac0 >> 0x30);
  local_908._0_2_ = (short)local_668;
  local_908._2_2_ = (short)((ulong)local_668 >> 0x10);
  local_908._4_2_ = (short)((ulong)local_668 >> 0x20);
  local_908._6_2_ = (short)((ulong)local_668 >> 0x30);
  uStack_900._0_2_ = (short)uStack_ae0;
  uStack_900._2_2_ = (short)((ulong)uStack_ae0 >> 0x10);
  uStack_900._4_2_ = (short)((ulong)uStack_ae0 >> 0x20);
  uStack_900._6_2_ = (short)((ulong)uStack_ae0 >> 0x30);
  local_b58 = auVar57._0_8_;
  uStack_b50 = auVar57._8_8_;
  local_b68 = auVar58._0_8_;
  uStack_b60 = auVar58._8_8_;
  local_918 = local_b58;
  uVar29 = local_918;
  uStack_910 = uStack_b50;
  uVar30 = uStack_910;
  local_928 = local_b68;
  uVar27 = local_928;
  uStack_920 = uStack_b60;
  uVar28 = uStack_920;
  local_918._0_2_ = auVar57._0_2_;
  local_918._2_2_ = auVar57._2_2_;
  local_918._4_2_ = auVar57._4_2_;
  local_918._6_2_ = auVar57._6_2_;
  uStack_910._0_2_ = auVar57._8_2_;
  uStack_910._2_2_ = auVar57._10_2_;
  uStack_910._4_2_ = auVar57._12_2_;
  uStack_910._6_2_ = auVar57._14_2_;
  local_928._0_2_ = auVar58._0_2_;
  local_928._2_2_ = auVar58._2_2_;
  local_928._4_2_ = auVar58._4_2_;
  local_928._6_2_ = auVar58._6_2_;
  uStack_920._0_2_ = auVar58._8_2_;
  uStack_920._2_2_ = auVar58._10_2_;
  uStack_920._4_2_ = auVar58._12_2_;
  uStack_920._6_2_ = auVar58._14_2_;
  local_238 = CONCAT26(local_8f8._6_2_ - local_908._6_2_,
                       CONCAT24(local_8f8._4_2_ - local_908._4_2_,
                                CONCAT22(local_8f8._2_2_ - local_908._2_2_,
                                         (short)local_8f8 - (short)local_908)));
  uStack_230 = CONCAT26(uStack_8f0._6_2_ - uStack_900._6_2_,
                        CONCAT24(uStack_8f0._4_2_ - uStack_900._4_2_,
                                 CONCAT22(uStack_8f0._2_2_ - uStack_900._2_2_,
                                          (short)uStack_8f0 - (short)uStack_900)));
  local_248 = CONCAT26(local_918._6_2_ - local_928._6_2_,
                       CONCAT24(local_918._4_2_ - local_928._4_2_,
                                CONCAT22(local_918._2_2_ - local_928._2_2_,
                                         (short)local_918 - (short)local_928)));
  uStack_240 = CONCAT26(uStack_910._6_2_ - uStack_920._6_2_,
                        CONCAT24(uStack_910._4_2_ - uStack_920._4_2_,
                                 CONCAT22(uStack_910._2_2_ - uStack_920._2_2_,
                                          (short)uStack_910 - (short)uStack_920)));
  sVar55 = ((short)local_8f8 - (short)local_908) + ((short)local_918 - (short)local_928);
  sVar59 = (local_8f8._2_2_ - local_908._2_2_) + (local_918._2_2_ - local_928._2_2_);
  sVar61 = (local_8f8._4_2_ - local_908._4_2_) + (local_918._4_2_ - local_928._4_2_);
  sVar63 = (local_8f8._6_2_ - local_908._6_2_) + (local_918._6_2_ - local_928._6_2_);
  sVar65 = ((short)uStack_8f0 - (short)uStack_900) + ((short)uStack_910 - (short)uStack_920);
  sVar67 = (uStack_8f0._2_2_ - uStack_900._2_2_) + (uStack_910._2_2_ - uStack_920._2_2_);
  sVar73 = (uStack_8f0._4_2_ - uStack_900._4_2_) + (uStack_910._4_2_ - uStack_920._4_2_);
  sVar79 = (uStack_8f0._6_2_ - uStack_900._6_2_) + (uStack_910._6_2_ - uStack_920._6_2_);
  uStack_50 = uStack_ac0;
  auVar14._8_8_ = uStack_ac0;
  auVar14._0_8_ = local_628;
  auVar13._8_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar13._0_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar57 = pmulhw(auVar14,auVar13);
  uStack_70 = uStack_ae0;
  auVar12._8_8_ = uStack_ae0;
  auVar12._0_8_ = local_668;
  auVar11._8_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar11._0_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar58 = pmulhw(auVar12,auVar11);
  uStack_250 = uStack_ac0;
  uStack_260 = uStack_ae0;
  local_ba8 = auVar57._0_8_;
  uStack_ba0 = auVar57._8_8_;
  local_bb8 = auVar58._0_8_;
  uStack_bb0 = auVar58._8_8_;
  local_278 = local_ba8;
  uVar51 = local_278;
  uStack_270 = uStack_ba0;
  uVar52 = uStack_270;
  local_288 = local_bb8;
  uVar49 = local_288;
  uStack_280 = uStack_bb0;
  uVar50 = uStack_280;
  local_278._0_2_ = auVar57._0_2_;
  local_278._2_2_ = auVar57._2_2_;
  local_278._4_2_ = auVar57._4_2_;
  local_278._6_2_ = auVar57._6_2_;
  uStack_270._0_2_ = auVar57._8_2_;
  uStack_270._2_2_ = auVar57._10_2_;
  uStack_270._4_2_ = auVar57._12_2_;
  uStack_270._6_2_ = auVar57._14_2_;
  local_288._0_2_ = auVar58._0_2_;
  local_288._2_2_ = auVar58._2_2_;
  local_288._4_2_ = auVar58._4_2_;
  local_288._6_2_ = auVar58._6_2_;
  uStack_280._0_2_ = auVar58._8_2_;
  uStack_280._2_2_ = auVar58._10_2_;
  uStack_280._4_2_ = auVar58._12_2_;
  uStack_280._6_2_ = auVar58._14_2_;
  local_298 = CONCAT26(local_8f8._6_2_ + local_908._6_2_,
                       CONCAT24(local_8f8._4_2_ + local_908._4_2_,
                                CONCAT22(local_8f8._2_2_ + local_908._2_2_,
                                         (short)local_8f8 + (short)local_908)));
  uStack_290 = CONCAT26(uStack_8f0._6_2_ + uStack_900._6_2_,
                        CONCAT24(uStack_8f0._4_2_ + uStack_900._4_2_,
                                 CONCAT22(uStack_8f0._2_2_ + uStack_900._2_2_,
                                          (short)uStack_8f0 + (short)uStack_900)));
  local_2a8 = CONCAT26(local_278._6_2_ + local_288._6_2_,
                       CONCAT24(local_278._4_2_ + local_288._4_2_,
                                CONCAT22(local_278._2_2_ + local_288._2_2_,
                                         (short)local_278 + (short)local_288)));
  uStack_2a0 = CONCAT26(uStack_270._6_2_ + uStack_280._6_2_,
                        CONCAT24(uStack_270._4_2_ + uStack_280._4_2_,
                                 CONCAT22(uStack_270._2_2_ + uStack_280._2_2_,
                                          (short)uStack_270 + (short)uStack_280)));
  sVar56 = (short)local_8f8 + (short)local_908 + (short)local_278 + (short)local_288;
  sVar60 = local_8f8._2_2_ + local_908._2_2_ + local_278._2_2_ + local_288._2_2_;
  sVar62 = local_8f8._4_2_ + local_908._4_2_ + local_278._4_2_ + local_288._4_2_;
  sVar64 = local_8f8._6_2_ + local_908._6_2_ + local_278._6_2_ + local_288._6_2_;
  sVar66 = (short)uStack_8f0 + (short)uStack_900 + (short)uStack_270 + (short)uStack_280;
  sVar68 = uStack_8f0._2_2_ + uStack_900._2_2_ + uStack_270._2_2_ + uStack_280._2_2_;
  sVar74 = uStack_8f0._4_2_ + uStack_900._4_2_ + uStack_270._4_2_ + uStack_280._4_2_;
  sVar80 = uStack_8f0._6_2_ + uStack_900._6_2_ + uStack_270._6_2_ + uStack_280._6_2_;
  local_2b8 = CONCAT26(local_218._6_2_ + local_228._6_2_,
                       CONCAT24(local_218._4_2_ + local_228._4_2_,
                                CONCAT22(local_218._2_2_ + local_228._2_2_,
                                         (short)local_218 + (short)local_228)));
  uStack_2b0 = CONCAT26(uStack_210._6_2_ + uStack_220._6_2_,
                        CONCAT24(uStack_210._4_2_ + uStack_220._4_2_,
                                 CONCAT22(uStack_210._2_2_ + uStack_220._2_2_,
                                          (short)uStack_210 + (short)uStack_220)));
  local_2c8 = CONCAT26(sVar64,CONCAT24(sVar62,CONCAT22(sVar60,sVar56)));
  uStack_2c0 = CONCAT26(sVar80,CONCAT24(sVar74,CONCAT22(sVar68,sVar66)));
  local_2d8 = CONCAT26(local_218._6_2_ - local_228._6_2_,
                       CONCAT24(local_218._4_2_ - local_228._4_2_,
                                CONCAT22(local_218._2_2_ - local_228._2_2_,
                                         (short)local_218 - (short)local_228)));
  uStack_2d0 = CONCAT26(uStack_210._6_2_ - uStack_220._6_2_,
                        CONCAT24(uStack_210._4_2_ - uStack_220._4_2_,
                                 CONCAT22(uStack_210._2_2_ - uStack_220._2_2_,
                                          (short)uStack_210 - (short)uStack_220)));
  local_2e8 = CONCAT26(sVar63,CONCAT24(sVar61,CONCAT22(sVar59,sVar55)));
  uStack_2e0 = CONCAT26(sVar79,CONCAT24(sVar73,CONCAT22(sVar67,sVar65)));
  local_938 = CONCAT26(local_218._6_2_ - local_228._6_2_,
                       CONCAT24(local_218._4_2_ - local_228._4_2_,
                                CONCAT22(local_218._2_2_ - local_228._2_2_,
                                         (short)local_218 - (short)local_228)));
  uStack_930 = CONCAT26(uStack_210._6_2_ - uStack_220._6_2_,
                        CONCAT24(uStack_210._4_2_ - uStack_220._4_2_,
                                 CONCAT22(uStack_210._2_2_ - uStack_220._2_2_,
                                          (short)uStack_210 - (short)uStack_220)));
  local_948 = CONCAT26(sVar63,CONCAT24(sVar61,CONCAT22(sVar59,sVar55)));
  uStack_940 = CONCAT26(sVar79,CONCAT24(sVar73,CONCAT22(sVar67,sVar65)));
  local_958 = CONCAT26(local_218._6_2_ + local_228._6_2_,
                       CONCAT24(local_218._4_2_ + local_228._4_2_,
                                CONCAT22(local_218._2_2_ + local_228._2_2_,
                                         (short)local_218 + (short)local_228)));
  uStack_950 = CONCAT26(uStack_210._6_2_ + uStack_220._6_2_,
                        CONCAT24(uStack_210._4_2_ + uStack_220._4_2_,
                                 CONCAT22(uStack_210._2_2_ + uStack_220._2_2_,
                                          (short)uStack_210 + (short)uStack_220)));
  local_968 = CONCAT26(sVar64,CONCAT24(sVar62,CONCAT22(sVar60,sVar56)));
  uStack_960 = CONCAT26(sVar80,CONCAT24(sVar74,CONCAT22(sVar68,sVar66)));
  in1_00 = (__m128i *)&local_aa8;
  in0_00 = (__m128i *)&local_a98;
  local_a44 = in_ECX;
  local_a40 = in_RDX;
  local_a30 = in_RDI;
  local_928 = uVar27;
  uStack_920 = uVar28;
  local_918 = uVar29;
  uStack_910 = uVar30;
  local_908 = local_668;
  uStack_900 = uVar33;
  local_8f8 = local_628;
  uStack_8f0 = uVar34;
  local_848 = local_a58;
  uStack_840 = uStack_a50;
  local_828 = local_a68;
  uStack_820 = uStack_a60;
  local_648 = local_8e8;
  local_608 = local_8d8;
  local_288 = uVar49;
  uStack_280 = uVar50;
  local_278 = uVar51;
  uStack_270 = uVar52;
  local_268 = local_668;
  local_258 = local_628;
  local_228 = local_8e8;
  uStack_220 = uVar53;
  local_218 = local_8d8;
  uStack_210 = uVar54;
  local_88 = local_a68;
  uStack_80 = uStack_a60;
  local_78 = local_668;
  local_68 = local_a58;
  uStack_60 = uStack_a50;
  local_58 = local_628;
  local_48 = local_a58;
  uStack_40 = uStack_a50;
  local_38 = local_668;
  local_28 = local_a68;
  uStack_20 = uStack_a60;
  local_18 = local_628;
  VP8Transpose_2_4x4_16b
            (in0_00,in1_00,in_stack_fffffffffffff1f8,in1_00,in0_00,(__m128i *)0x16666d,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff3a6,
                      CONCAT24(in_stack_fffffffffffff3a4,
                               CONCAT22(in_stack_fffffffffffff3a2,in_stack_fffffffffffff3a0))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff3ae,
                      CONCAT24(in_stack_fffffffffffff3ac,
                               CONCAT22(in_stack_fffffffffffff3aa,in_stack_fffffffffffff3a8))));
  local_a0e = 4;
  local_7ea = 4;
  local_7ec = 4;
  local_7ee = 4;
  local_7f0 = 4;
  local_7f2 = 4;
  local_7f4 = 4;
  local_7f6 = 4;
  local_7f8 = 4;
  local_808 = 0x4000400040004;
  uStack_800 = 0x4000400040004;
  local_2f8 = local_a78;
  uVar53 = local_2f8;
  uStack_2f0 = uStack_a70;
  uVar54 = uStack_2f0;
  local_2f8._0_2_ = (short)local_a78;
  local_2f8._2_2_ = (short)((ulong)local_a78 >> 0x10);
  local_2f8._4_2_ = (short)((ulong)local_a78 >> 0x20);
  local_2f8._6_2_ = (short)((ulong)local_a78 >> 0x30);
  uStack_2f0._0_2_ = (short)uStack_a70;
  uStack_2f0._2_2_ = (short)((ulong)uStack_a70 >> 0x10);
  uStack_2f0._4_2_ = (short)((ulong)uStack_a70 >> 0x20);
  uStack_2f0._6_2_ = (short)((ulong)uStack_a70 >> 0x30);
  local_2f8._0_2_ = (short)local_2f8 + 4;
  local_2f8._2_2_ = local_2f8._2_2_ + 4;
  local_2f8._4_2_ = local_2f8._4_2_ + 4;
  local_2f8._6_2_ = local_2f8._6_2_ + 4;
  uStack_2f0._0_2_ = (short)uStack_2f0 + 4;
  uStack_2f0._2_2_ = uStack_2f0._2_2_ + 4;
  uStack_2f0._4_2_ = uStack_2f0._4_2_ + 4;
  uStack_2f0._6_2_ = uStack_2f0._6_2_ + 4;
  local_318 = CONCAT26(local_2f8._6_2_,
                       CONCAT24(local_2f8._4_2_,CONCAT22(local_2f8._2_2_,(short)local_2f8)));
  uStack_310 = CONCAT26(uStack_2f0._6_2_,
                        CONCAT24(uStack_2f0._4_2_,CONCAT22(uStack_2f0._2_2_,(short)uStack_2f0)));
  local_328 = local_a98;
  lVar41 = local_328;
  uStack_320 = lStack_a90;
  lVar42 = uStack_320;
  local_328._0_2_ = (short)local_a98;
  local_328._2_2_ = (short)((ulong)local_a98 >> 0x10);
  local_328._4_2_ = (short)((ulong)local_a98 >> 0x20);
  local_328._6_2_ = (short)((ulong)local_a98 >> 0x30);
  uStack_320._0_2_ = (short)lStack_a90;
  uStack_320._2_2_ = (short)((ulong)lStack_a90 >> 0x10);
  uStack_320._4_2_ = (short)((ulong)lStack_a90 >> 0x20);
  uStack_320._6_2_ = (short)((ulong)lStack_a90 >> 0x30);
  sVar55 = (short)local_2f8 + (short)local_328;
  sVar60 = local_2f8._2_2_ + local_328._2_2_;
  sVar63 = local_2f8._4_2_ + local_328._4_2_;
  sVar66 = local_2f8._6_2_ + local_328._6_2_;
  sVar73 = (short)uStack_2f0 + (short)uStack_320;
  sVar69 = uStack_2f0._2_2_ + uStack_320._2_2_;
  sVar75 = uStack_2f0._4_2_ + uStack_320._4_2_;
  sVar81 = uStack_2f0._6_2_ + uStack_320._6_2_;
  local_978 = CONCAT26(local_2f8._6_2_,
                       CONCAT24(local_2f8._4_2_,CONCAT22(local_2f8._2_2_,(short)local_2f8)));
  uStack_970 = CONCAT26(uStack_2f0._6_2_,
                        CONCAT24(uStack_2f0._4_2_,CONCAT22(uStack_2f0._2_2_,(short)uStack_2f0)));
  local_988 = local_a98;
  lStack_980 = lStack_a90;
  local_2f8._0_2_ = (short)local_2f8 - (short)local_328;
  local_2f8._2_2_ = local_2f8._2_2_ - local_328._2_2_;
  local_2f8._4_2_ = local_2f8._4_2_ - local_328._4_2_;
  local_2f8._6_2_ = local_2f8._6_2_ - local_328._6_2_;
  sVar74 = (short)uStack_2f0 - (short)uStack_320;
  sVar70 = uStack_2f0._2_2_ - uStack_320._2_2_;
  sVar76 = uStack_2f0._4_2_ - uStack_320._4_2_;
  sVar82 = uStack_2f0._6_2_ - uStack_320._6_2_;
  local_98 = local_a88;
  uStack_90 = uStack_a80;
  local_a8 = local_a68;
  uStack_a0 = uStack_a60;
  auVar10._8_8_ = uStack_a80;
  auVar10._0_8_ = local_a88;
  auVar9._8_8_ = uStack_a60;
  auVar9._0_8_ = local_a68;
  auVar57 = pmulhw(auVar10,auVar9);
  local_b8 = local_aa8;
  lStack_b0 = lStack_aa0;
  local_c8 = local_a58;
  uStack_c0 = uStack_a50;
  auVar8._8_8_ = lStack_aa0;
  auVar8._0_8_ = local_aa8;
  auVar7._8_8_ = uStack_a50;
  auVar7._0_8_ = local_a58;
  auVar58 = pmulhw(auVar8,auVar7);
  local_998 = local_a88;
  uVar33 = local_998;
  uStack_990 = uStack_a80;
  uVar34 = uStack_990;
  local_9a8 = local_aa8;
  lVar31 = local_9a8;
  uStack_9a0 = lStack_aa0;
  lVar32 = uStack_9a0;
  local_998._0_2_ = (short)local_a88;
  local_998._2_2_ = (short)((ulong)local_a88 >> 0x10);
  local_998._4_2_ = (short)((ulong)local_a88 >> 0x20);
  local_998._6_2_ = (short)((ulong)local_a88 >> 0x30);
  uStack_990._0_2_ = (short)uStack_a80;
  uStack_990._2_2_ = (short)((ulong)uStack_a80 >> 0x10);
  uStack_990._4_2_ = (short)((ulong)uStack_a80 >> 0x20);
  uStack_990._6_2_ = (short)((ulong)uStack_a80 >> 0x30);
  local_9a8._0_2_ = (short)local_aa8;
  local_9a8._2_2_ = (short)((ulong)local_aa8 >> 0x10);
  local_9a8._4_2_ = (short)((ulong)local_aa8 >> 0x20);
  local_9a8._6_2_ = (short)((ulong)local_aa8 >> 0x30);
  uStack_9a0._0_2_ = (short)lStack_aa0;
  uStack_9a0._2_2_ = (short)((ulong)lStack_aa0 >> 0x10);
  uStack_9a0._4_2_ = (short)((ulong)lStack_aa0 >> 0x20);
  uStack_9a0._6_2_ = (short)((ulong)lStack_aa0 >> 0x30);
  local_c78 = auVar57._0_8_;
  uStack_c70 = auVar57._8_8_;
  local_c88 = auVar58._0_8_;
  uStack_c80 = auVar58._8_8_;
  local_9b8 = local_c78;
  uVar29 = local_9b8;
  uStack_9b0 = uStack_c70;
  uVar30 = uStack_9b0;
  local_9c8 = local_c88;
  uVar27 = local_9c8;
  uStack_9c0 = uStack_c80;
  uVar28 = uStack_9c0;
  local_9b8._0_2_ = auVar57._0_2_;
  local_9b8._2_2_ = auVar57._2_2_;
  local_9b8._4_2_ = auVar57._4_2_;
  local_9b8._6_2_ = auVar57._6_2_;
  uStack_9b0._0_2_ = auVar57._8_2_;
  uStack_9b0._2_2_ = auVar57._10_2_;
  uStack_9b0._4_2_ = auVar57._12_2_;
  uStack_9b0._6_2_ = auVar57._14_2_;
  local_9c8._0_2_ = auVar58._0_2_;
  local_9c8._2_2_ = auVar58._2_2_;
  local_9c8._4_2_ = auVar58._4_2_;
  local_9c8._6_2_ = auVar58._6_2_;
  uStack_9c0._0_2_ = auVar58._8_2_;
  uStack_9c0._2_2_ = auVar58._10_2_;
  uStack_9c0._4_2_ = auVar58._12_2_;
  uStack_9c0._6_2_ = auVar58._14_2_;
  local_338 = CONCAT26(local_998._6_2_ - local_9a8._6_2_,
                       CONCAT24(local_998._4_2_ - local_9a8._4_2_,
                                CONCAT22(local_998._2_2_ - local_9a8._2_2_,
                                         (short)local_998 - (short)local_9a8)));
  uStack_330 = CONCAT26(uStack_990._6_2_ - uStack_9a0._6_2_,
                        CONCAT24(uStack_990._4_2_ - uStack_9a0._4_2_,
                                 CONCAT22(uStack_990._2_2_ - uStack_9a0._2_2_,
                                          (short)uStack_990 - (short)uStack_9a0)));
  local_348 = CONCAT26(local_9b8._6_2_ - local_9c8._6_2_,
                       CONCAT24(local_9b8._4_2_ - local_9c8._4_2_,
                                CONCAT22(local_9b8._2_2_ - local_9c8._2_2_,
                                         (short)local_9b8 - (short)local_9c8)));
  uStack_340 = CONCAT26(uStack_9b0._6_2_ - uStack_9c0._6_2_,
                        CONCAT24(uStack_9b0._4_2_ - uStack_9c0._4_2_,
                                 CONCAT22(uStack_9b0._2_2_ - uStack_9c0._2_2_,
                                          (short)uStack_9b0 - (short)uStack_9c0)));
  sVar56 = ((short)local_998 - (short)local_9a8) + ((short)local_9b8 - (short)local_9c8);
  sVar61 = (local_998._2_2_ - local_9a8._2_2_) + (local_9b8._2_2_ - local_9c8._2_2_);
  sVar64 = (local_998._4_2_ - local_9a8._4_2_) + (local_9b8._4_2_ - local_9c8._4_2_);
  sVar67 = (local_998._6_2_ - local_9a8._6_2_) + (local_9b8._6_2_ - local_9c8._6_2_);
  sVar79 = ((short)uStack_990 - (short)uStack_9a0) + ((short)uStack_9b0 - (short)uStack_9c0);
  sVar71 = (uStack_990._2_2_ - uStack_9a0._2_2_) + (uStack_9b0._2_2_ - uStack_9c0._2_2_);
  sVar77 = (uStack_990._4_2_ - uStack_9a0._4_2_) + (uStack_9b0._4_2_ - uStack_9c0._4_2_);
  sVar83 = (uStack_990._6_2_ - uStack_9a0._6_2_) + (uStack_9b0._6_2_ - uStack_9c0._6_2_);
  local_d8 = local_a88;
  uStack_d0 = uStack_a80;
  local_e8 = local_a58;
  uStack_e0 = uStack_a50;
  auVar6._8_8_ = uStack_a80;
  auVar6._0_8_ = local_a88;
  auVar5._8_8_ = uStack_a50;
  auVar5._0_8_ = local_a58;
  auVar57 = pmulhw(auVar6,auVar5);
  local_f8 = local_aa8;
  lStack_f0 = lStack_aa0;
  local_108 = local_a68;
  uStack_100 = uStack_a60;
  auVar4._8_8_ = lStack_aa0;
  auVar4._0_8_ = local_aa8;
  auVar3._8_8_ = uStack_a60;
  auVar3._0_8_ = local_a68;
  auVar58 = pmulhw(auVar4,auVar3);
  local_358 = local_a88;
  uStack_350 = uStack_a80;
  local_368 = local_aa8;
  lStack_360 = lStack_aa0;
  local_cc8 = auVar57._0_8_;
  uStack_cc0 = auVar57._8_8_;
  local_cd8 = auVar58._0_8_;
  uStack_cd0 = auVar58._8_8_;
  local_378 = local_cc8;
  uVar51 = local_378;
  uStack_370 = uStack_cc0;
  uVar52 = uStack_370;
  local_388 = local_cd8;
  uVar49 = local_388;
  uStack_380 = uStack_cd0;
  uVar50 = uStack_380;
  local_378._0_2_ = auVar57._0_2_;
  local_378._2_2_ = auVar57._2_2_;
  local_378._4_2_ = auVar57._4_2_;
  local_378._6_2_ = auVar57._6_2_;
  uStack_370._0_2_ = auVar57._8_2_;
  uStack_370._2_2_ = auVar57._10_2_;
  uStack_370._4_2_ = auVar57._12_2_;
  uStack_370._6_2_ = auVar57._14_2_;
  local_388._0_2_ = auVar58._0_2_;
  local_388._2_2_ = auVar58._2_2_;
  local_388._4_2_ = auVar58._4_2_;
  local_388._6_2_ = auVar58._6_2_;
  uStack_380._0_2_ = auVar58._8_2_;
  uStack_380._2_2_ = auVar58._10_2_;
  uStack_380._4_2_ = auVar58._12_2_;
  uStack_380._6_2_ = auVar58._14_2_;
  local_398 = CONCAT26(local_998._6_2_ + local_9a8._6_2_,
                       CONCAT24(local_998._4_2_ + local_9a8._4_2_,
                                CONCAT22(local_998._2_2_ + local_9a8._2_2_,
                                         (short)local_998 + (short)local_9a8)));
  uStack_390 = CONCAT26(uStack_990._6_2_ + uStack_9a0._6_2_,
                        CONCAT24(uStack_990._4_2_ + uStack_9a0._4_2_,
                                 CONCAT22(uStack_990._2_2_ + uStack_9a0._2_2_,
                                          (short)uStack_990 + (short)uStack_9a0)));
  local_3a8 = CONCAT26(local_378._6_2_ + local_388._6_2_,
                       CONCAT24(local_378._4_2_ + local_388._4_2_,
                                CONCAT22(local_378._2_2_ + local_388._2_2_,
                                         (short)local_378 + (short)local_388)));
  uStack_3a0 = CONCAT26(uStack_370._6_2_ + uStack_380._6_2_,
                        CONCAT24(uStack_370._4_2_ + uStack_380._4_2_,
                                 CONCAT22(uStack_370._2_2_ + uStack_380._2_2_,
                                          (short)uStack_370 + (short)uStack_380)));
  sVar59 = (short)local_998 + (short)local_9a8 + (short)local_378 + (short)local_388;
  sVar62 = local_998._2_2_ + local_9a8._2_2_ + local_378._2_2_ + local_388._2_2_;
  sVar65 = local_998._4_2_ + local_9a8._4_2_ + local_378._4_2_ + local_388._4_2_;
  sVar68 = local_998._6_2_ + local_9a8._6_2_ + local_378._6_2_ + local_388._6_2_;
  sVar80 = (short)uStack_990 + (short)uStack_9a0 + (short)uStack_370 + (short)uStack_380;
  sVar72 = uStack_990._2_2_ + uStack_9a0._2_2_ + uStack_370._2_2_ + uStack_380._2_2_;
  sVar78 = uStack_990._4_2_ + uStack_9a0._4_2_ + uStack_370._4_2_ + uStack_380._4_2_;
  sVar84 = uStack_990._6_2_ + uStack_9a0._6_2_ + uStack_370._6_2_ + uStack_380._6_2_;
  local_3b8 = CONCAT26(sVar66,CONCAT24(sVar63,CONCAT22(sVar60,sVar55)));
  uStack_3b0 = CONCAT26(sVar81,CONCAT24(sVar75,CONCAT22(sVar69,sVar73)));
  local_3c8 = CONCAT26(sVar68,CONCAT24(sVar65,CONCAT22(sVar62,sVar59)));
  uStack_3c0 = CONCAT26(sVar84,CONCAT24(sVar78,CONCAT22(sVar72,sVar80)));
  local_3d8 = CONCAT26(local_2f8._6_2_,
                       CONCAT24(local_2f8._4_2_,CONCAT22(local_2f8._2_2_,(short)local_2f8)));
  uStack_3d0 = CONCAT26(sVar82,CONCAT24(sVar76,CONCAT22(sVar70,sVar74)));
  local_3e8 = CONCAT26(sVar67,CONCAT24(sVar64,CONCAT22(sVar61,sVar56)));
  uStack_3e0 = CONCAT26(sVar83,CONCAT24(sVar77,CONCAT22(sVar71,sVar79)));
  local_9d8 = CONCAT26(local_2f8._6_2_,
                       CONCAT24(local_2f8._4_2_,CONCAT22(local_2f8._2_2_,(short)local_2f8)));
  uStack_9d0 = CONCAT26(sVar82,CONCAT24(sVar76,CONCAT22(sVar70,sVar74)));
  local_9e8 = CONCAT26(sVar67,CONCAT24(sVar64,CONCAT22(sVar61,sVar56)));
  uStack_9e0 = CONCAT26(sVar83,CONCAT24(sVar77,CONCAT22(sVar71,sVar79)));
  local_9f8 = CONCAT26(sVar66,CONCAT24(sVar63,CONCAT22(sVar60,sVar55)));
  uStack_9f0 = CONCAT26(sVar81,CONCAT24(sVar75,CONCAT22(sVar69,sVar73)));
  local_a08 = CONCAT26(sVar68,CONCAT24(sVar65,CONCAT22(sVar62,sVar59)));
  uStack_a00 = CONCAT26(sVar84,CONCAT24(sVar78,CONCAT22(sVar72,sVar80)));
  local_858 = CONCAT26(sVar66 + sVar68,
                       CONCAT24(sVar63 + sVar65,CONCAT22(sVar60 + sVar62,sVar55 + sVar59)));
  uStack_850 = CONCAT26(sVar81 + sVar84,
                        CONCAT24(sVar75 + sVar78,CONCAT22(sVar69 + sVar72,sVar73 + sVar80)));
  local_85c = 3;
  auVar2._8_8_ = uStack_850;
  auVar2._0_8_ = local_858;
  psraw(auVar2,ZEXT416(3));
  local_878 = CONCAT26(local_2f8._6_2_ + sVar67,
                       CONCAT24(local_2f8._4_2_ + sVar64,
                                CONCAT22(local_2f8._2_2_ + sVar61,(short)local_2f8 + sVar56)));
  uStack_870 = CONCAT26(sVar82 + sVar83,
                        CONCAT24(sVar76 + sVar77,CONCAT22(sVar70 + sVar71,sVar74 + sVar79)));
  local_87c = 3;
  auVar1._8_8_ = uStack_870;
  auVar1._0_8_ = local_878;
  psraw(auVar1,ZEXT416(3));
  local_898 = CONCAT26(local_2f8._6_2_ - sVar67,
                       CONCAT24(local_2f8._4_2_ - sVar64,
                                CONCAT22(local_2f8._2_2_ - sVar61,(short)local_2f8 - sVar56)));
  uStack_890 = CONCAT26(sVar82 - sVar83,
                        CONCAT24(sVar76 - sVar77,CONCAT22(sVar70 - sVar71,sVar74 - sVar79)));
  local_89c = 3;
  auVar58._8_8_ = uStack_890;
  auVar58._0_8_ = local_898;
  psraw(auVar58,ZEXT416(3));
  local_8b8 = CONCAT26(sVar66 - sVar68,
                       CONCAT24(sVar63 - sVar65,CONCAT22(sVar60 - sVar62,sVar55 - sVar59)));
  uStack_8b0 = CONCAT26(sVar81 - sVar84,
                        CONCAT24(sVar75 - sVar78,CONCAT22(sVar69 - sVar72,sVar73 - sVar80)));
  local_8bc = 3;
  auVar57._8_8_ = uStack_8b0;
  auVar57._0_8_ = local_8b8;
  psraw(auVar57,ZEXT416(3));
  local_9c8 = uVar27;
  uStack_9c0 = uVar28;
  local_9b8 = uVar29;
  uStack_9b0 = uVar30;
  local_9a8 = lVar31;
  uStack_9a0 = lVar32;
  local_998 = uVar33;
  uStack_990 = uVar34;
  local_388 = uVar49;
  uStack_380 = uVar50;
  local_378 = uVar51;
  uStack_370 = uVar52;
  local_328 = lVar41;
  uStack_320 = lVar42;
  local_308 = local_808;
  uStack_300 = uStack_800;
  local_2f8 = uVar53;
  uStack_2f0 = uVar54;
  VP8Transpose_2_4x4_16b
            (in0_00,in1_00,in_stack_fffffffffffff1f8,in1_00,in0_00,(__m128i *)0x166c77,
             (__m128i *)CONCAT26(sVar82,CONCAT24(sVar76,CONCAT22(sVar70,sVar74))),
             (__m128i *)CONCAT26(sVar66,CONCAT24(sVar63,CONCAT22(sVar60,sVar55))));
  local_a28 = 0;
  uStack_a20 = 0;
  if (local_a44 == 0) {
    local_10c = WebPMemToUint32((uint8_t *)local_a30);
    local_128._4_4_ = 0;
    local_128._0_4_ = local_10c;
    local_da8 = local_128._0_8_;
    local_128 = ZEXT416(local_10c);
    local_12c = WebPMemToUint32((uint8_t *)(local_a30 + 4));
    local_148._4_4_ = 0;
    local_148._0_4_ = local_12c;
    local_db8 = local_148._0_8_;
    local_148 = ZEXT416(local_12c);
    local_14c = WebPMemToUint32((uint8_t *)(local_a30 + 8));
    local_168._4_4_ = 0;
    local_168._0_4_ = local_14c;
    local_dc8 = local_168._0_8_;
    local_168 = ZEXT416(local_14c);
    local_16c = WebPMemToUint32((uint8_t *)(local_a30 + 0xc));
    local_188._4_4_ = 0;
    local_188._0_4_ = local_16c;
    local_dd8 = local_188._0_8_;
    local_188 = ZEXT416(local_16c);
  }
  else {
    local_6f0 = local_a30;
    local_da8 = *local_a30;
    uStack_700 = 0;
    local_710 = local_a30 + 4;
    local_db8 = *local_710;
    uStack_720 = 0;
    local_730 = local_a30 + 8;
    local_dc8 = *local_730;
    uStack_740 = 0;
    local_750 = local_a30 + 0xc;
    local_dd8 = *local_750;
    uStack_760 = 0;
    local_768 = local_dd8;
    local_748 = local_dc8;
    local_728 = local_db8;
    local_708 = local_da8;
  }
  local_4f8 = local_da8;
  uVar38 = local_4f8;
  uStack_4f0 = 0;
  local_508 = 0;
  uStack_500 = 0;
  local_4f8._1_1_ = (byte)(local_da8 >> 8);
  local_4f8._2_1_ = (byte)(local_da8 >> 0x10);
  local_4f8._3_1_ = (byte)(local_da8 >> 0x18);
  local_4f8._4_1_ = (byte)(local_da8 >> 0x20);
  local_4f8._5_1_ = (byte)(local_da8 >> 0x28);
  local_4f8._6_1_ = (byte)(local_da8 >> 0x30);
  local_4f8._7_1_ = (byte)(local_da8 >> 0x38);
  local_da8._0_2_ = (ushort)(byte)local_da8;
  uVar25 = (ushort)local_da8;
  local_da8._0_3_ = CONCAT12(local_4f8._1_1_,(ushort)local_da8);
  local_da8._0_4_ = (uint)(uint3)local_da8;
  local_da8._0_5_ = CONCAT14(local_4f8._2_1_,(uint)local_da8);
  local_da8._0_6_ = (uint6)(uint5)local_da8;
  local_da8._0_7_ = CONCAT16(local_4f8._3_1_,(uint6)local_da8);
  local_da8 = (ulong)(uint7)local_da8;
  uStack_da0._0_2_ = (ushort)local_4f8._4_1_;
  uVar26 = (ushort)uStack_da0;
  uStack_da0._0_3_ = CONCAT12(local_4f8._5_1_,(ushort)uStack_da0);
  uStack_da0._0_4_ = (uint)(uint3)uStack_da0;
  uStack_da0._0_5_ = CONCAT14(local_4f8._6_1_,(uint)uStack_da0);
  uStack_da0._0_6_ = (uint6)(uint5)uStack_da0;
  uStack_da0._0_7_ = CONCAT16(local_4f8._7_1_,(uint6)uStack_da0);
  uStack_da0 = (ulong)(uint7)uStack_da0;
  local_518 = local_db8;
  uVar37 = local_518;
  uStack_510 = 0;
  local_528 = 0;
  uStack_520 = 0;
  local_518._1_1_ = (byte)(local_db8 >> 8);
  local_518._2_1_ = (byte)(local_db8 >> 0x10);
  local_518._3_1_ = (byte)(local_db8 >> 0x18);
  local_518._4_1_ = (byte)(local_db8 >> 0x20);
  local_518._5_1_ = (byte)(local_db8 >> 0x28);
  local_518._6_1_ = (byte)(local_db8 >> 0x30);
  local_518._7_1_ = (byte)(local_db8 >> 0x38);
  local_db8._0_2_ = (ushort)(byte)local_db8;
  uVar23 = (ushort)local_db8;
  local_db8._0_3_ = CONCAT12(local_518._1_1_,(ushort)local_db8);
  local_db8._0_4_ = (uint)(uint3)local_db8;
  local_db8._0_5_ = CONCAT14(local_518._2_1_,(uint)local_db8);
  local_db8._0_6_ = (uint6)(uint5)local_db8;
  local_db8._0_7_ = CONCAT16(local_518._3_1_,(uint6)local_db8);
  local_db8 = (ulong)(uint7)local_db8;
  uStack_db0._0_2_ = (ushort)local_518._4_1_;
  uVar24 = (ushort)uStack_db0;
  uStack_db0._0_3_ = CONCAT12(local_518._5_1_,(ushort)uStack_db0);
  uStack_db0._0_4_ = (uint)(uint3)uStack_db0;
  uStack_db0._0_5_ = CONCAT14(local_518._6_1_,(uint)uStack_db0);
  uStack_db0._0_6_ = (uint6)(uint5)uStack_db0;
  uStack_db0._0_7_ = CONCAT16(local_518._7_1_,(uint6)uStack_db0);
  uStack_db0 = (ulong)(uint7)uStack_db0;
  local_538 = local_dc8;
  uVar36 = local_538;
  uStack_530 = 0;
  local_548 = 0;
  uStack_540 = 0;
  local_538._1_1_ = (byte)(local_dc8 >> 8);
  local_538._2_1_ = (byte)(local_dc8 >> 0x10);
  local_538._3_1_ = (byte)(local_dc8 >> 0x18);
  local_538._4_1_ = (byte)(local_dc8 >> 0x20);
  local_538._5_1_ = (byte)(local_dc8 >> 0x28);
  local_538._6_1_ = (byte)(local_dc8 >> 0x30);
  local_538._7_1_ = (byte)(local_dc8 >> 0x38);
  local_dc8._0_2_ = (ushort)(byte)local_dc8;
  uVar21 = (ushort)local_dc8;
  local_dc8._0_3_ = CONCAT12(local_538._1_1_,(ushort)local_dc8);
  local_dc8._0_4_ = (uint)(uint3)local_dc8;
  local_dc8._0_5_ = CONCAT14(local_538._2_1_,(uint)local_dc8);
  local_dc8._0_6_ = (uint6)(uint5)local_dc8;
  local_dc8._0_7_ = CONCAT16(local_538._3_1_,(uint6)local_dc8);
  local_dc8 = (ulong)(uint7)local_dc8;
  uStack_dc0._0_2_ = (ushort)local_538._4_1_;
  uVar22 = (ushort)uStack_dc0;
  uStack_dc0._0_3_ = CONCAT12(local_538._5_1_,(ushort)uStack_dc0);
  uStack_dc0._0_4_ = (uint)(uint3)uStack_dc0;
  uStack_dc0._0_5_ = CONCAT14(local_538._6_1_,(uint)uStack_dc0);
  uStack_dc0._0_6_ = (uint6)(uint5)uStack_dc0;
  uStack_dc0._0_7_ = CONCAT16(local_538._7_1_,(uint6)uStack_dc0);
  uStack_dc0 = (ulong)(uint7)uStack_dc0;
  local_558 = local_dd8;
  uVar35 = local_558;
  uStack_550 = 0;
  local_568 = 0;
  uStack_560 = 0;
  local_558._1_1_ = (byte)(local_dd8 >> 8);
  local_558._2_1_ = (byte)(local_dd8 >> 0x10);
  local_558._3_1_ = (byte)(local_dd8 >> 0x18);
  local_558._4_1_ = (byte)(local_dd8 >> 0x20);
  local_558._5_1_ = (byte)(local_dd8 >> 0x28);
  local_558._6_1_ = (byte)(local_dd8 >> 0x30);
  local_558._7_1_ = (byte)(local_dd8 >> 0x38);
  local_dd8._0_2_ = (ushort)(byte)local_dd8;
  uVar19 = (ushort)local_dd8;
  local_dd8._0_3_ = CONCAT12(local_558._1_1_,(ushort)local_dd8);
  local_dd8._0_4_ = (uint)(uint3)local_dd8;
  local_dd8._0_5_ = CONCAT14(local_558._2_1_,(uint)local_dd8);
  local_dd8._0_6_ = (uint6)(uint5)local_dd8;
  local_dd8._0_7_ = CONCAT16(local_558._3_1_,(uint6)local_dd8);
  local_dd8 = (ulong)(uint7)local_dd8;
  uStack_dd0._0_2_ = (ushort)local_558._4_1_;
  uVar20 = (ushort)uStack_dd0;
  uStack_dd0._0_3_ = CONCAT12(local_558._5_1_,(ushort)uStack_dd0);
  uStack_dd0._0_4_ = (uint)(uint3)uStack_dd0;
  uStack_dd0._0_5_ = CONCAT14(local_558._6_1_,(uint)uStack_dd0);
  uStack_dd0._0_6_ = (uint6)(uint5)uStack_dd0;
  uStack_dd0._0_7_ = CONCAT16(local_558._7_1_,(uint6)uStack_dd0);
  uStack_dd0 = (ulong)(uint7)uStack_dd0;
  local_3f8 = local_da8;
  uVar47 = local_3f8;
  uStack_3f0 = uStack_da0;
  uVar48 = uStack_3f0;
  local_408 = local_a78;
  uVar29 = local_408;
  uStack_400 = uStack_a70;
  uVar30 = uStack_400;
  local_3f8._2_2_ = (ushort)local_4f8._1_1_;
  local_3f8._4_2_ = (ushort)local_4f8._2_1_;
  local_3f8._6_2_ = (ushort)local_4f8._3_1_;
  uStack_3f0._2_2_ = (ushort)local_4f8._5_1_;
  uStack_3f0._4_2_ = (ushort)local_4f8._6_1_;
  uStack_3f0._6_2_ = (ushort)local_4f8._7_1_;
  local_408._0_2_ = (short)local_a78;
  local_408._2_2_ = (short)((ulong)local_a78 >> 0x10);
  local_408._4_2_ = (short)((ulong)local_a78 >> 0x20);
  local_408._6_2_ = (short)((ulong)local_a78 >> 0x30);
  uStack_400._0_2_ = (short)uStack_a70;
  uStack_400._2_2_ = (short)((ulong)uStack_a70 >> 0x10);
  uStack_400._4_2_ = (short)((ulong)uStack_a70 >> 0x20);
  uStack_400._6_2_ = (short)((ulong)uStack_a70 >> 0x30);
  local_408._0_2_ = uVar25 + (short)local_408;
  local_408._2_2_ = local_3f8._2_2_ + local_408._2_2_;
  local_408._4_2_ = local_3f8._4_2_ + local_408._4_2_;
  local_408._6_2_ = local_3f8._6_2_ + local_408._6_2_;
  uStack_400._0_2_ = uVar26 + (short)uStack_400;
  uStack_400._2_2_ = uStack_3f0._2_2_ + uStack_400._2_2_;
  uStack_400._4_2_ = uStack_3f0._4_2_ + uStack_400._4_2_;
  uStack_400._6_2_ = uStack_3f0._6_2_ + uStack_400._6_2_;
  local_da8._0_4_ = CONCAT22(local_408._2_2_,(short)local_408);
  local_da8._0_6_ = CONCAT24(local_408._4_2_,(uint)local_da8);
  local_da8 = CONCAT26(local_408._6_2_,(uint6)local_da8);
  uStack_da0._0_4_ = CONCAT22(uStack_400._2_2_,(short)uStack_400);
  uStack_da0._0_6_ = CONCAT24(uStack_400._4_2_,(uint)uStack_da0);
  uStack_da0 = CONCAT26(uStack_400._6_2_,(uint6)uStack_da0);
  local_418 = local_db8;
  uVar45 = local_418;
  uStack_410 = uStack_db0;
  uVar46 = uStack_410;
  local_428 = local_a88;
  uVar27 = local_428;
  uStack_420 = uStack_a80;
  uVar28 = uStack_420;
  local_418._2_2_ = (ushort)local_518._1_1_;
  local_418._4_2_ = (ushort)local_518._2_1_;
  local_418._6_2_ = (ushort)local_518._3_1_;
  uStack_410._2_2_ = (ushort)local_518._5_1_;
  uStack_410._4_2_ = (ushort)local_518._6_1_;
  uStack_410._6_2_ = (ushort)local_518._7_1_;
  local_428._0_2_ = (short)local_a88;
  local_428._2_2_ = (short)((ulong)local_a88 >> 0x10);
  local_428._4_2_ = (short)((ulong)local_a88 >> 0x20);
  local_428._6_2_ = (short)((ulong)local_a88 >> 0x30);
  uStack_420._0_2_ = (short)uStack_a80;
  uStack_420._2_2_ = (short)((ulong)uStack_a80 >> 0x10);
  uStack_420._4_2_ = (short)((ulong)uStack_a80 >> 0x20);
  uStack_420._6_2_ = (short)((ulong)uStack_a80 >> 0x30);
  local_428._0_2_ = uVar23 + (short)local_428;
  local_428._2_2_ = local_418._2_2_ + local_428._2_2_;
  local_428._4_2_ = local_418._4_2_ + local_428._4_2_;
  local_428._6_2_ = local_418._6_2_ + local_428._6_2_;
  uStack_420._0_2_ = uVar24 + (short)uStack_420;
  uStack_420._2_2_ = uStack_410._2_2_ + uStack_420._2_2_;
  uStack_420._4_2_ = uStack_410._4_2_ + uStack_420._4_2_;
  uStack_420._6_2_ = uStack_410._6_2_ + uStack_420._6_2_;
  local_db8._0_4_ = CONCAT22(local_428._2_2_,(short)local_428);
  local_db8._0_6_ = CONCAT24(local_428._4_2_,(uint)local_db8);
  local_db8 = CONCAT26(local_428._6_2_,(uint6)local_db8);
  uStack_db0._0_4_ = CONCAT22(uStack_420._2_2_,(short)uStack_420);
  uStack_db0._0_6_ = CONCAT24(uStack_420._4_2_,(uint)uStack_db0);
  uStack_db0 = CONCAT26(uStack_420._6_2_,(uint6)uStack_db0);
  local_438 = local_dc8;
  uVar43 = local_438;
  uStack_430 = uStack_dc0;
  uVar44 = uStack_430;
  local_448 = local_a98;
  lVar41 = local_448;
  uStack_440 = lStack_a90;
  lVar42 = uStack_440;
  local_438._2_2_ = (ushort)local_538._1_1_;
  local_438._4_2_ = (ushort)local_538._2_1_;
  local_438._6_2_ = (ushort)local_538._3_1_;
  uStack_430._2_2_ = (ushort)local_538._5_1_;
  uStack_430._4_2_ = (ushort)local_538._6_1_;
  uStack_430._6_2_ = (ushort)local_538._7_1_;
  local_448._0_2_ = (short)local_a98;
  local_448._2_2_ = (short)((ulong)local_a98 >> 0x10);
  local_448._4_2_ = (short)((ulong)local_a98 >> 0x20);
  local_448._6_2_ = (short)((ulong)local_a98 >> 0x30);
  uStack_440._0_2_ = (short)lStack_a90;
  uStack_440._2_2_ = (short)((ulong)lStack_a90 >> 0x10);
  uStack_440._4_2_ = (short)((ulong)lStack_a90 >> 0x20);
  uStack_440._6_2_ = (short)((ulong)lStack_a90 >> 0x30);
  local_448._0_2_ = uVar21 + (short)local_448;
  local_448._2_2_ = local_438._2_2_ + local_448._2_2_;
  local_448._4_2_ = local_438._4_2_ + local_448._4_2_;
  local_448._6_2_ = local_438._6_2_ + local_448._6_2_;
  uStack_440._0_2_ = uVar22 + (short)uStack_440;
  uStack_440._2_2_ = uStack_430._2_2_ + uStack_440._2_2_;
  uStack_440._4_2_ = uStack_430._4_2_ + uStack_440._4_2_;
  uStack_440._6_2_ = uStack_430._6_2_ + uStack_440._6_2_;
  local_dc8._0_4_ = CONCAT22(local_448._2_2_,(short)local_448);
  local_dc8._0_6_ = CONCAT24(local_448._4_2_,(uint)local_dc8);
  local_dc8 = CONCAT26(local_448._6_2_,(uint6)local_dc8);
  uStack_dc0._0_4_ = CONCAT22(uStack_440._2_2_,(short)uStack_440);
  uStack_dc0._0_6_ = CONCAT24(uStack_440._4_2_,(uint)uStack_dc0);
  uStack_dc0 = CONCAT26(uStack_440._6_2_,(uint6)uStack_dc0);
  local_458 = local_dd8;
  uVar39 = local_458;
  uStack_450 = uStack_dd0;
  uVar40 = uStack_450;
  local_468 = local_aa8;
  lVar31 = local_468;
  uStack_460 = lStack_aa0;
  lVar32 = uStack_460;
  local_458._2_2_ = (ushort)local_558._1_1_;
  local_458._4_2_ = (ushort)local_558._2_1_;
  local_458._6_2_ = (ushort)local_558._3_1_;
  uStack_450._2_2_ = (ushort)local_558._5_1_;
  uStack_450._4_2_ = (ushort)local_558._6_1_;
  uStack_450._6_2_ = (ushort)local_558._7_1_;
  local_468._0_2_ = (short)local_aa8;
  local_468._2_2_ = (short)((ulong)local_aa8 >> 0x10);
  local_468._4_2_ = (short)((ulong)local_aa8 >> 0x20);
  local_468._6_2_ = (short)((ulong)local_aa8 >> 0x30);
  uStack_460._0_2_ = (short)lStack_aa0;
  uStack_460._2_2_ = (short)((ulong)lStack_aa0 >> 0x10);
  uStack_460._4_2_ = (short)((ulong)lStack_aa0 >> 0x20);
  uStack_460._6_2_ = (short)((ulong)lStack_aa0 >> 0x30);
  local_468._0_2_ = uVar19 + (short)local_468;
  local_468._2_2_ = local_458._2_2_ + local_468._2_2_;
  local_468._4_2_ = local_458._4_2_ + local_468._4_2_;
  local_468._6_2_ = local_458._6_2_ + local_468._6_2_;
  uStack_460._0_2_ = uVar20 + (short)uStack_460;
  uStack_460._2_2_ = uStack_450._2_2_ + uStack_460._2_2_;
  uStack_460._4_2_ = uStack_450._4_2_ + uStack_460._4_2_;
  uStack_460._6_2_ = uStack_450._6_2_ + uStack_460._6_2_;
  local_dd8._0_4_ = CONCAT22(local_468._2_2_,(short)local_468);
  local_dd8._0_6_ = CONCAT24(local_468._4_2_,(uint)local_dd8);
  local_dd8 = CONCAT26(local_468._6_2_,(uint6)local_dd8);
  uStack_dd0._0_4_ = CONCAT22(uStack_460._2_2_,(short)uStack_460);
  uStack_dd0._0_6_ = CONCAT24(uStack_460._4_2_,(uint)uStack_dd0);
  uStack_dd0 = CONCAT26(uStack_460._6_2_,(uint6)uStack_dd0);
  local_478 = local_da8;
  uStack_470 = uStack_da0;
  local_488 = local_da8;
  uStack_480 = uStack_da0;
  local_da8._0_2_ =
       CONCAT11((0 < local_408._2_2_) * (local_408._2_2_ < 0x100) * (char)local_408._2_2_ -
                (0xff < local_408._2_2_),
                (0 < (short)local_408) * ((short)local_408 < 0x100) * (char)(short)local_408 -
                (0xff < (short)local_408));
  local_da8._0_3_ =
       CONCAT12((0 < local_408._4_2_) * (local_408._4_2_ < 0x100) * (char)local_408._4_2_ -
                (0xff < local_408._4_2_),(ushort)local_da8);
  local_da8._0_4_ =
       CONCAT13((0 < local_408._6_2_) * (local_408._6_2_ < 0x100) * (char)local_408._6_2_ -
                (0xff < local_408._6_2_),(uint3)local_da8);
  local_da8._0_5_ =
       CONCAT14((0 < (short)uStack_400) * ((short)uStack_400 < 0x100) * (char)(short)uStack_400 -
                (0xff < (short)uStack_400),(uint)local_da8);
  local_da8._0_6_ =
       CONCAT15((0 < uStack_400._2_2_) * (uStack_400._2_2_ < 0x100) * (char)uStack_400._2_2_ -
                (0xff < uStack_400._2_2_),(uint5)local_da8);
  local_da8._0_7_ =
       CONCAT16((0 < uStack_400._4_2_) * (uStack_400._4_2_ < 0x100) * (char)uStack_400._4_2_ -
                (0xff < uStack_400._4_2_),(uint6)local_da8);
  local_da8 = CONCAT17((0 < uStack_400._6_2_) * (uStack_400._6_2_ < 0x100) * (char)uStack_400._6_2_
                       - (0xff < uStack_400._6_2_),(uint7)local_da8);
  uStack_da0._0_2_ =
       CONCAT11((0 < local_408._2_2_) * (local_408._2_2_ < 0x100) * (char)local_408._2_2_ -
                (0xff < local_408._2_2_),
                (0 < (short)local_408) * ((short)local_408 < 0x100) * (char)(short)local_408 -
                (0xff < (short)local_408));
  uStack_da0._0_3_ =
       CONCAT12((0 < local_408._4_2_) * (local_408._4_2_ < 0x100) * (char)local_408._4_2_ -
                (0xff < local_408._4_2_),(ushort)uStack_da0);
  uStack_da0._0_4_ =
       CONCAT13((0 < local_408._6_2_) * (local_408._6_2_ < 0x100) * (char)local_408._6_2_ -
                (0xff < local_408._6_2_),(uint3)uStack_da0);
  uStack_da0._0_5_ =
       CONCAT14((0 < (short)uStack_400) * ((short)uStack_400 < 0x100) * (char)(short)uStack_400 -
                (0xff < (short)uStack_400),(uint)uStack_da0);
  uStack_da0._0_6_ =
       CONCAT15((0 < uStack_400._2_2_) * (uStack_400._2_2_ < 0x100) * (char)uStack_400._2_2_ -
                (0xff < uStack_400._2_2_),(uint5)uStack_da0);
  uStack_da0._0_7_ =
       CONCAT16((0 < uStack_400._4_2_) * (uStack_400._4_2_ < 0x100) * (char)uStack_400._4_2_ -
                (0xff < uStack_400._4_2_),(uint6)uStack_da0);
  uStack_da0 = CONCAT17((0 < uStack_400._6_2_) * (uStack_400._6_2_ < 0x100) * (char)uStack_400._6_2_
                        - (0xff < uStack_400._6_2_),(uint7)uStack_da0);
  local_498 = local_db8;
  uStack_490 = uStack_db0;
  local_4a8 = local_db8;
  uStack_4a0 = uStack_db0;
  local_db8._0_2_ =
       CONCAT11((0 < local_428._2_2_) * (local_428._2_2_ < 0x100) * (char)local_428._2_2_ -
                (0xff < local_428._2_2_),
                (0 < (short)local_428) * ((short)local_428 < 0x100) * (char)(short)local_428 -
                (0xff < (short)local_428));
  local_db8._0_3_ =
       CONCAT12((0 < local_428._4_2_) * (local_428._4_2_ < 0x100) * (char)local_428._4_2_ -
                (0xff < local_428._4_2_),(ushort)local_db8);
  local_db8._0_4_ =
       CONCAT13((0 < local_428._6_2_) * (local_428._6_2_ < 0x100) * (char)local_428._6_2_ -
                (0xff < local_428._6_2_),(uint3)local_db8);
  local_db8._0_5_ =
       CONCAT14((0 < (short)uStack_420) * ((short)uStack_420 < 0x100) * (char)(short)uStack_420 -
                (0xff < (short)uStack_420),(uint)local_db8);
  local_db8._0_6_ =
       CONCAT15((0 < uStack_420._2_2_) * (uStack_420._2_2_ < 0x100) * (char)uStack_420._2_2_ -
                (0xff < uStack_420._2_2_),(uint5)local_db8);
  local_db8._0_7_ =
       CONCAT16((0 < uStack_420._4_2_) * (uStack_420._4_2_ < 0x100) * (char)uStack_420._4_2_ -
                (0xff < uStack_420._4_2_),(uint6)local_db8);
  local_db8 = CONCAT17((0 < uStack_420._6_2_) * (uStack_420._6_2_ < 0x100) * (char)uStack_420._6_2_
                       - (0xff < uStack_420._6_2_),(uint7)local_db8);
  uStack_db0._0_2_ =
       CONCAT11((0 < local_428._2_2_) * (local_428._2_2_ < 0x100) * (char)local_428._2_2_ -
                (0xff < local_428._2_2_),
                (0 < (short)local_428) * ((short)local_428 < 0x100) * (char)(short)local_428 -
                (0xff < (short)local_428));
  uStack_db0._0_3_ =
       CONCAT12((0 < local_428._4_2_) * (local_428._4_2_ < 0x100) * (char)local_428._4_2_ -
                (0xff < local_428._4_2_),(ushort)uStack_db0);
  uStack_db0._0_4_ =
       CONCAT13((0 < local_428._6_2_) * (local_428._6_2_ < 0x100) * (char)local_428._6_2_ -
                (0xff < local_428._6_2_),(uint3)uStack_db0);
  uStack_db0._0_5_ =
       CONCAT14((0 < (short)uStack_420) * ((short)uStack_420 < 0x100) * (char)(short)uStack_420 -
                (0xff < (short)uStack_420),(uint)uStack_db0);
  uStack_db0._0_6_ =
       CONCAT15((0 < uStack_420._2_2_) * (uStack_420._2_2_ < 0x100) * (char)uStack_420._2_2_ -
                (0xff < uStack_420._2_2_),(uint5)uStack_db0);
  uStack_db0._0_7_ =
       CONCAT16((0 < uStack_420._4_2_) * (uStack_420._4_2_ < 0x100) * (char)uStack_420._4_2_ -
                (0xff < uStack_420._4_2_),(uint6)uStack_db0);
  uStack_db0 = CONCAT17((0 < uStack_420._6_2_) * (uStack_420._6_2_ < 0x100) * (char)uStack_420._6_2_
                        - (0xff < uStack_420._6_2_),(uint7)uStack_db0);
  local_4b8 = local_dc8;
  uStack_4b0 = uStack_dc0;
  local_4c8 = local_dc8;
  uStack_4c0 = uStack_dc0;
  local_dc8._0_2_ =
       CONCAT11((0 < local_448._2_2_) * (local_448._2_2_ < 0x100) * (char)local_448._2_2_ -
                (0xff < local_448._2_2_),
                (0 < (short)local_448) * ((short)local_448 < 0x100) * (char)(short)local_448 -
                (0xff < (short)local_448));
  local_dc8._0_3_ =
       CONCAT12((0 < local_448._4_2_) * (local_448._4_2_ < 0x100) * (char)local_448._4_2_ -
                (0xff < local_448._4_2_),(ushort)local_dc8);
  local_dc8._0_4_ =
       CONCAT13((0 < local_448._6_2_) * (local_448._6_2_ < 0x100) * (char)local_448._6_2_ -
                (0xff < local_448._6_2_),(uint3)local_dc8);
  local_dc8._0_5_ =
       CONCAT14((0 < (short)uStack_440) * ((short)uStack_440 < 0x100) * (char)(short)uStack_440 -
                (0xff < (short)uStack_440),(uint)local_dc8);
  local_dc8._0_6_ =
       CONCAT15((0 < uStack_440._2_2_) * (uStack_440._2_2_ < 0x100) * (char)uStack_440._2_2_ -
                (0xff < uStack_440._2_2_),(uint5)local_dc8);
  local_dc8._0_7_ =
       CONCAT16((0 < uStack_440._4_2_) * (uStack_440._4_2_ < 0x100) * (char)uStack_440._4_2_ -
                (0xff < uStack_440._4_2_),(uint6)local_dc8);
  local_dc8 = CONCAT17((0 < uStack_440._6_2_) * (uStack_440._6_2_ < 0x100) * (char)uStack_440._6_2_
                       - (0xff < uStack_440._6_2_),(uint7)local_dc8);
  uStack_dc0._0_2_ =
       CONCAT11((0 < local_448._2_2_) * (local_448._2_2_ < 0x100) * (char)local_448._2_2_ -
                (0xff < local_448._2_2_),
                (0 < (short)local_448) * ((short)local_448 < 0x100) * (char)(short)local_448 -
                (0xff < (short)local_448));
  uStack_dc0._0_3_ =
       CONCAT12((0 < local_448._4_2_) * (local_448._4_2_ < 0x100) * (char)local_448._4_2_ -
                (0xff < local_448._4_2_),(ushort)uStack_dc0);
  uStack_dc0._0_4_ =
       CONCAT13((0 < local_448._6_2_) * (local_448._6_2_ < 0x100) * (char)local_448._6_2_ -
                (0xff < local_448._6_2_),(uint3)uStack_dc0);
  uStack_dc0._0_5_ =
       CONCAT14((0 < (short)uStack_440) * ((short)uStack_440 < 0x100) * (char)(short)uStack_440 -
                (0xff < (short)uStack_440),(uint)uStack_dc0);
  uStack_dc0._0_6_ =
       CONCAT15((0 < uStack_440._2_2_) * (uStack_440._2_2_ < 0x100) * (char)uStack_440._2_2_ -
                (0xff < uStack_440._2_2_),(uint5)uStack_dc0);
  uStack_dc0._0_7_ =
       CONCAT16((0 < uStack_440._4_2_) * (uStack_440._4_2_ < 0x100) * (char)uStack_440._4_2_ -
                (0xff < uStack_440._4_2_),(uint6)uStack_dc0);
  uStack_dc0 = CONCAT17((0 < uStack_440._6_2_) * (uStack_440._6_2_ < 0x100) * (char)uStack_440._6_2_
                        - (0xff < uStack_440._6_2_),(uint7)uStack_dc0);
  local_4d8 = local_dd8;
  uStack_4d0 = uStack_dd0;
  local_4e8 = local_dd8;
  uStack_4e0 = uStack_dd0;
  local_dd8._0_2_ =
       CONCAT11((0 < local_468._2_2_) * (local_468._2_2_ < 0x100) * (char)local_468._2_2_ -
                (0xff < local_468._2_2_),
                (0 < (short)local_468) * ((short)local_468 < 0x100) * (char)(short)local_468 -
                (0xff < (short)local_468));
  local_dd8._0_3_ =
       CONCAT12((0 < local_468._4_2_) * (local_468._4_2_ < 0x100) * (char)local_468._4_2_ -
                (0xff < local_468._4_2_),(ushort)local_dd8);
  local_dd8._0_4_ =
       CONCAT13((0 < local_468._6_2_) * (local_468._6_2_ < 0x100) * (char)local_468._6_2_ -
                (0xff < local_468._6_2_),(uint3)local_dd8);
  local_dd8._0_5_ =
       CONCAT14((0 < (short)uStack_460) * ((short)uStack_460 < 0x100) * (char)(short)uStack_460 -
                (0xff < (short)uStack_460),(uint)local_dd8);
  local_dd8._0_6_ =
       CONCAT15((0 < uStack_460._2_2_) * (uStack_460._2_2_ < 0x100) * (char)uStack_460._2_2_ -
                (0xff < uStack_460._2_2_),(uint5)local_dd8);
  local_dd8._0_7_ =
       CONCAT16((0 < uStack_460._4_2_) * (uStack_460._4_2_ < 0x100) * (char)uStack_460._4_2_ -
                (0xff < uStack_460._4_2_),(uint6)local_dd8);
  local_dd8 = CONCAT17((0 < uStack_460._6_2_) * (uStack_460._6_2_ < 0x100) * (char)uStack_460._6_2_
                       - (0xff < uStack_460._6_2_),(uint7)local_dd8);
  uStack_dd0._0_2_ =
       CONCAT11((0 < local_468._2_2_) * (local_468._2_2_ < 0x100) * (char)local_468._2_2_ -
                (0xff < local_468._2_2_),
                (0 < (short)local_468) * ((short)local_468 < 0x100) * (char)(short)local_468 -
                (0xff < (short)local_468));
  uStack_dd0._0_3_ =
       CONCAT12((0 < local_468._4_2_) * (local_468._4_2_ < 0x100) * (char)local_468._4_2_ -
                (0xff < local_468._4_2_),(ushort)uStack_dd0);
  uStack_dd0._0_4_ =
       CONCAT13((0 < local_468._6_2_) * (local_468._6_2_ < 0x100) * (char)local_468._6_2_ -
                (0xff < local_468._6_2_),(uint3)uStack_dd0);
  uStack_dd0._0_5_ =
       CONCAT14((0 < (short)uStack_460) * ((short)uStack_460 < 0x100) * (char)(short)uStack_460 -
                (0xff < (short)uStack_460),(uint)uStack_dd0);
  uStack_dd0._0_6_ =
       CONCAT15((0 < uStack_460._2_2_) * (uStack_460._2_2_ < 0x100) * (char)uStack_460._2_2_ -
                (0xff < uStack_460._2_2_),(uint5)uStack_dd0);
  uStack_dd0._0_7_ =
       CONCAT16((0 < uStack_460._4_2_) * (uStack_460._4_2_ < 0x100) * (char)uStack_460._4_2_ -
                (0xff < uStack_460._4_2_),(uint6)uStack_dd0);
  uStack_dd0 = CONCAT17((0 < uStack_460._6_2_) * (uStack_460._6_2_ < 0x100) * (char)uStack_460._6_2_
                        - (0xff < uStack_460._6_2_),(uint7)uStack_dd0);
  if (local_a44 == 0) {
    local_778 = local_da8;
    uStack_770 = uStack_da0;
    local_788 = local_da8;
    uStack_780 = uStack_da0;
    local_558 = uVar35;
    local_538 = uVar36;
    local_518 = uVar37;
    local_4f8 = uVar38;
    local_468 = lVar31;
    uStack_460 = lVar32;
    local_458 = uVar39;
    uStack_450 = uVar40;
    local_448 = lVar41;
    uStack_440 = lVar42;
    local_438 = uVar43;
    uStack_430 = uVar44;
    local_428 = uVar27;
    uStack_420 = uVar28;
    local_418 = uVar45;
    uStack_410 = uVar46;
    local_408 = uVar29;
    uStack_400 = uVar30;
    local_3f8 = uVar47;
    uStack_3f0 = uVar48;
    WebPUint32ToMem(local_a40,(uint)local_da8);
    local_798 = local_db8;
    uStack_790 = uStack_db0;
    local_7a8 = local_db8;
    uStack_7a0 = uStack_db0;
    WebPUint32ToMem(local_a40 + 0x20,(uint)local_db8);
    local_7b8 = local_dc8;
    uStack_7b0 = uStack_dc0;
    local_7c8 = local_dc8;
    uStack_7c0 = uStack_dc0;
    WebPUint32ToMem(local_a40 + 0x40,(uint)local_dc8);
    local_7d8 = local_dd8;
    uStack_7d0 = uStack_dd0;
    local_7e8 = local_dd8;
    uStack_7e0 = uStack_dd0;
    WebPUint32ToMem(local_a40 + 0x60,(uint)local_dd8);
  }
  else {
    *(ulong *)local_a40 = local_da8;
    *(ulong *)(local_a40 + 0x20) = local_db8;
    *(ulong *)(local_a40 + 0x40) = local_dc8;
    *(ulong *)(local_a40 + 0x60) = local_dd8;
  }
  return;
}

Assistant:

static void ITransform_SSE2(const uint8_t* ref, const int16_t* in, uint8_t* dst,
                            int do_two) {
  // This implementation makes use of 16-bit fixed point versions of two
  // multiply constants:
  //    K1 = sqrt(2) * cos (pi/8) ~= 85627 / 2^16
  //    K2 = sqrt(2) * sin (pi/8) ~= 35468 / 2^16
  //
  // To be able to use signed 16-bit integers, we use the following trick to
  // have constants within range:
  // - Associated constants are obtained by subtracting the 16-bit fixed point
  //   version of one:
  //      k = K - (1 << 16)  =>  K = k + (1 << 16)
  //      K1 = 85267  =>  k1 =  20091
  //      K2 = 35468  =>  k2 = -30068
  // - The multiplication of a variable by a constant become the sum of the
  //   variable and the multiplication of that variable by the associated
  //   constant:
  //      (x * K) >> 16 = (x * (k + (1 << 16))) >> 16 = ((x * k ) >> 16) + x
  const __m128i k1 = _mm_set1_epi16(20091);
  const __m128i k2 = _mm_set1_epi16(-30068);
  __m128i T0, T1, T2, T3;

  // Load and concatenate the transform coefficients (we'll do two inverse
  // transforms in parallel). In the case of only one inverse transform, the
  // second half of the vectors will just contain random value we'll never
  // use nor store.
  __m128i in0, in1, in2, in3;
  {
    in0 = _mm_loadl_epi64((const __m128i*)&in[0]);
    in1 = _mm_loadl_epi64((const __m128i*)&in[4]);
    in2 = _mm_loadl_epi64((const __m128i*)&in[8]);
    in3 = _mm_loadl_epi64((const __m128i*)&in[12]);
    // a00 a10 a20 a30   x x x x
    // a01 a11 a21 a31   x x x x
    // a02 a12 a22 a32   x x x x
    // a03 a13 a23 a33   x x x x
    if (do_two) {
      const __m128i inB0 = _mm_loadl_epi64((const __m128i*)&in[16]);
      const __m128i inB1 = _mm_loadl_epi64((const __m128i*)&in[20]);
      const __m128i inB2 = _mm_loadl_epi64((const __m128i*)&in[24]);
      const __m128i inB3 = _mm_loadl_epi64((const __m128i*)&in[28]);
      in0 = _mm_unpacklo_epi64(in0, inB0);
      in1 = _mm_unpacklo_epi64(in1, inB1);
      in2 = _mm_unpacklo_epi64(in2, inB2);
      in3 = _mm_unpacklo_epi64(in3, inB3);
      // a00 a10 a20 a30   b00 b10 b20 b30
      // a01 a11 a21 a31   b01 b11 b21 b31
      // a02 a12 a22 a32   b02 b12 b22 b32
      // a03 a13 a23 a33   b03 b13 b23 b33
    }
  }

  // Vertical pass and subsequent transpose.
  {
    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i a = _mm_add_epi16(in0, in2);
    const __m128i b = _mm_sub_epi16(in0, in2);
    // c = MUL(in1, K2) - MUL(in3, K1) = MUL(in1, k2) - MUL(in3, k1) + in1 - in3
    const __m128i c1 = _mm_mulhi_epi16(in1, k2);
    const __m128i c2 = _mm_mulhi_epi16(in3, k1);
    const __m128i c3 = _mm_sub_epi16(in1, in3);
    const __m128i c4 = _mm_sub_epi16(c1, c2);
    const __m128i c = _mm_add_epi16(c3, c4);
    // d = MUL(in1, K1) + MUL(in3, K2) = MUL(in1, k1) + MUL(in3, k2) + in1 + in3
    const __m128i d1 = _mm_mulhi_epi16(in1, k1);
    const __m128i d2 = _mm_mulhi_epi16(in3, k2);
    const __m128i d3 = _mm_add_epi16(in1, in3);
    const __m128i d4 = _mm_add_epi16(d1, d2);
    const __m128i d = _mm_add_epi16(d3, d4);

    // Second pass.
    const __m128i tmp0 = _mm_add_epi16(a, d);
    const __m128i tmp1 = _mm_add_epi16(b, c);
    const __m128i tmp2 = _mm_sub_epi16(b, c);
    const __m128i tmp3 = _mm_sub_epi16(a, d);

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&tmp0, &tmp1, &tmp2, &tmp3, &T0, &T1, &T2, &T3);
  }

  // Horizontal pass and subsequent transpose.
  {
    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i four = _mm_set1_epi16(4);
    const __m128i dc = _mm_add_epi16(T0, four);
    const __m128i a =  _mm_add_epi16(dc, T2);
    const __m128i b =  _mm_sub_epi16(dc, T2);
    // c = MUL(T1, K2) - MUL(T3, K1) = MUL(T1, k2) - MUL(T3, k1) + T1 - T3
    const __m128i c1 = _mm_mulhi_epi16(T1, k2);
    const __m128i c2 = _mm_mulhi_epi16(T3, k1);
    const __m128i c3 = _mm_sub_epi16(T1, T3);
    const __m128i c4 = _mm_sub_epi16(c1, c2);
    const __m128i c = _mm_add_epi16(c3, c4);
    // d = MUL(T1, K1) + MUL(T3, K2) = MUL(T1, k1) + MUL(T3, k2) + T1 + T3
    const __m128i d1 = _mm_mulhi_epi16(T1, k1);
    const __m128i d2 = _mm_mulhi_epi16(T3, k2);
    const __m128i d3 = _mm_add_epi16(T1, T3);
    const __m128i d4 = _mm_add_epi16(d1, d2);
    const __m128i d = _mm_add_epi16(d3, d4);

    // Second pass.
    const __m128i tmp0 = _mm_add_epi16(a, d);
    const __m128i tmp1 = _mm_add_epi16(b, c);
    const __m128i tmp2 = _mm_sub_epi16(b, c);
    const __m128i tmp3 = _mm_sub_epi16(a, d);
    const __m128i shifted0 = _mm_srai_epi16(tmp0, 3);
    const __m128i shifted1 = _mm_srai_epi16(tmp1, 3);
    const __m128i shifted2 = _mm_srai_epi16(tmp2, 3);
    const __m128i shifted3 = _mm_srai_epi16(tmp3, 3);

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&shifted0, &shifted1, &shifted2, &shifted3, &T0, &T1,
                           &T2, &T3);
  }

  // Add inverse transform to 'ref' and store.
  {
    const __m128i zero = _mm_setzero_si128();
    // Load the reference(s).
    __m128i ref0, ref1, ref2, ref3;
    if (do_two) {
      // Load eight bytes/pixels per line.
      ref0 = _mm_loadl_epi64((const __m128i*)&ref[0 * BPS]);
      ref1 = _mm_loadl_epi64((const __m128i*)&ref[1 * BPS]);
      ref2 = _mm_loadl_epi64((const __m128i*)&ref[2 * BPS]);
      ref3 = _mm_loadl_epi64((const __m128i*)&ref[3 * BPS]);
    } else {
      // Load four bytes/pixels per line.
      ref0 = _mm_cvtsi32_si128(WebPMemToUint32(&ref[0 * BPS]));
      ref1 = _mm_cvtsi32_si128(WebPMemToUint32(&ref[1 * BPS]));
      ref2 = _mm_cvtsi32_si128(WebPMemToUint32(&ref[2 * BPS]));
      ref3 = _mm_cvtsi32_si128(WebPMemToUint32(&ref[3 * BPS]));
    }
    // Convert to 16b.
    ref0 = _mm_unpacklo_epi8(ref0, zero);
    ref1 = _mm_unpacklo_epi8(ref1, zero);
    ref2 = _mm_unpacklo_epi8(ref2, zero);
    ref3 = _mm_unpacklo_epi8(ref3, zero);
    // Add the inverse transform(s).
    ref0 = _mm_add_epi16(ref0, T0);
    ref1 = _mm_add_epi16(ref1, T1);
    ref2 = _mm_add_epi16(ref2, T2);
    ref3 = _mm_add_epi16(ref3, T3);
    // Unsigned saturate to 8b.
    ref0 = _mm_packus_epi16(ref0, ref0);
    ref1 = _mm_packus_epi16(ref1, ref1);
    ref2 = _mm_packus_epi16(ref2, ref2);
    ref3 = _mm_packus_epi16(ref3, ref3);
    // Store the results.
    if (do_two) {
      // Store eight bytes/pixels per line.
      _mm_storel_epi64((__m128i*)&dst[0 * BPS], ref0);
      _mm_storel_epi64((__m128i*)&dst[1 * BPS], ref1);
      _mm_storel_epi64((__m128i*)&dst[2 * BPS], ref2);
      _mm_storel_epi64((__m128i*)&dst[3 * BPS], ref3);
    } else {
      // Store four bytes/pixels per line.
      WebPUint32ToMem(&dst[0 * BPS], _mm_cvtsi128_si32(ref0));
      WebPUint32ToMem(&dst[1 * BPS], _mm_cvtsi128_si32(ref1));
      WebPUint32ToMem(&dst[2 * BPS], _mm_cvtsi128_si32(ref2));
      WebPUint32ToMem(&dst[3 * BPS], _mm_cvtsi128_si32(ref3));
    }
  }
}